

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall cab_provision_complex::test_method(cab_provision_complex *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<cab> c;
  shared_ptr<cab_session> session;
  __weak_ptr<cab_session,(__gnu_cxx::_Lock_policy)2> local_158 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_150;
  __weak_ptr<cab_session,(__gnu_cxx::_Lock_policy)2> local_148 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_140;
  assertion_result local_138;
  undefined1 local_120 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_118;
  undefined1 *local_110;
  _List_node_base *local_108;
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_int>,_int,_boost::test_tools::assertion::op::EQ<unsigned_int,_int,_void>_>
  local_100;
  const_string local_f8;
  _List_node_base local_e8;
  const_string local_d8;
  const_string local_c8;
  cab_manager manager;
  
  cab_manager::cab_manager(&manager);
  session.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  session.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__weak_ptr<cab_session,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<cab_session,void>
            (local_148,&session.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>);
  cab_manager::create(&manager,(weak_ptr<cab_session> *)local_148);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_140);
  std::__weak_ptr<cab_session,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<cab_session,void>
            (local_158,&session.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>);
  cab_manager::create(&manager,(weak_ptr<cab_session> *)local_158);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_150);
  cab_manager::find_cab((cab_manager *)&c,(node_type)&manager,P1,8);
  cab::add_request(c.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_ptr,P1,P3,4);
  cab::update_position(c.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_ptr,P0);
  cab::update_position(c.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_ptr,I1);
  cab::update_position(c.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_ptr,P1);
  cab::update_position(c.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_ptr,I2);
  cab_manager::find_cab((cab_manager *)local_120,(node_type)&manager,P4,0xb);
  std::__shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&c.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2> *)local_120);
  this_00 = &local_118;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  local_c8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  local_c8.m_end = "";
  local_d8.m_begin = "";
  local_d8.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this_00,&local_c8,0x146,&local_d8);
  local_100.m_lhs.m_value = cab::id(c.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_100.m_rhs = 0;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_int>,_int,_boost::test_tools::assertion::op::EQ<unsigned_int,_int,_void>_>
  ::evaluate(&local_138,&local_100,false);
  local_108 = &local_e8;
  local_e8._M_next = (_List_node_base *)0x16de21;
  local_e8._M_prev = (_List_node_base *)0x16de2d;
  local_118._M_pi._0_1_ = false;
  local_120 = (undefined1  [8])&PTR__lazy_ostream_001a9520;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_f8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  local_f8.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)local_120,&local_f8,0x146,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&session.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  cab_manager::~cab_manager(&manager);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(cab_provision_complex)
{
    cab_manager manager;
    std::shared_ptr<cab_session> session = nullptr;
    
    manager.create(session);
    manager.create(session);

    node_type src = node_type::P1;
    node_type dst = node_type::P3;

    std::shared_ptr<cab> c = manager.find_cab(src, dst, 4);
    c->add_request(src, dst, 4);

    c->update_position(node_type::P0);
    c->update_position(node_type::I1);
    c->update_position(node_type::P1);
    c->update_position(node_type::I2);

    src = node_type::P4;
    dst = node_type::P5;

    c = manager.find_cab(src, dst, 1);

    BOOST_TEST(c->id() == 0);
}